

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MallocV.cpp
# Opt level: O1

vector<adios2::core::iovec,_std::allocator<adios2::core::iovec>_> * __thiscall
adios2::format::MallocV::DataVec
          (vector<adios2::core::iovec,_std::allocator<adios2::core::iovec>_> *__return_storage_ptr__
          ,MallocV *this)

{
  pointer pVVar1;
  char *pcVar2;
  pointer piVar3;
  long lVar4;
  long lVar5;
  char *pcVar6;
  allocator_type local_11;
  
  std::vector<adios2::core::iovec,_std::allocator<adios2::core::iovec>_>::vector
            (__return_storage_ptr__,
             (long)(this->super_BufferV).DataV.
                   super__Vector_base<adios2::format::BufferV::VecEntry,_std::allocator<adios2::format::BufferV::VecEntry>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->super_BufferV).DataV.
                   super__Vector_base<adios2::format::BufferV::VecEntry,_std::allocator<adios2::format::BufferV::VecEntry>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 5,&local_11);
  pVVar1 = (this->super_BufferV).DataV.
           super__Vector_base<adios2::format::BufferV::VecEntry,_std::allocator<adios2::format::BufferV::VecEntry>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar4 = (long)(this->super_BufferV).DataV.
                super__Vector_base<adios2::format::BufferV::VecEntry,_std::allocator<adios2::format::BufferV::VecEntry>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar1;
  if (lVar4 != 0) {
    lVar4 = lVar4 >> 5;
    pcVar2 = this->m_InternalBlock;
    piVar3 = (__return_storage_ptr__->
             super__Vector_base<adios2::core::iovec,_std::allocator<adios2::core::iovec>_>)._M_impl.
             super__Vector_impl_data._M_start;
    lVar4 = lVar4 + (ulong)(lVar4 == 0);
    lVar5 = 8;
    do {
      if (*(char *)((long)pVVar1 + lVar5 * 2 + -0x10) == '\x01') {
        pcVar6 = *(char **)((long)pVVar1 + lVar5 * 2 + -8);
      }
      else {
        pcVar6 = pcVar2 + *(long *)(&pVVar1->External + lVar5 * 2);
      }
      *(char **)((long)piVar3 + lVar5 + -8) = pcVar6;
      *(undefined8 *)((long)&piVar3->iov_base + lVar5) =
           *(undefined8 *)((long)&pVVar1->Base + lVar5 * 2);
      lVar5 = lVar5 + 0x10;
      lVar4 = lVar4 + -1;
    } while (lVar4 != 0);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<core::iovec> MallocV::DataVec() noexcept
{
    std::vector<core::iovec> iov(DataV.size());
    for (std::size_t i = 0; i < DataV.size(); ++i)
    {
        if (DataV[i].External)
        {
            iov[i].iov_base = DataV[i].Base;
        }
        else
        {
            iov[i].iov_base = m_InternalBlock + DataV[i].Offset;
        }
        iov[i].iov_len = DataV[i].Size;
    }
    return iov;
}